

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O2

bool handleGetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion,bool isGetNextRequest)

{
  ValueCallback *callback;
  undefined7 in_register_00000081;
  _Elt_pointer __args;
  _Elt_pointer pVVar1;
  shared_ptr<BER_CONTAINER> value;
  ERROR_STATUS_WITH_VALUE local_6c;
  deque<VarBind,std::allocator<VarBind>> *local_68;
  ValueCallback local_60;
  _Map_pointer local_48;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *local_40;
  _Elt_pointer local_38;
  
  __args = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pVVar1 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_48 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  local_38 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  local_60._20_4_ = SUB84(CONCAT71(in_register_00000081,isGetNextRequest),0);
  local_68 = (deque<VarBind,std::allocator<VarBind>> *)outResponseList;
  local_40 = callbacks;
  while (__args != local_38) {
    callback = ValueCallback::findCallback
                         (local_40,(__args->oid).
                                   super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          isGetNextRequest,0,(size_t *)0x0);
    if (callback == (ValueCallback *)0x0) {
      if (local_60.isSettable == false) {
        local_6c = 0x80;
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_60);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  (local_68,__args,(shared_ptr<ImplicitNullType> *)&local_60);
      }
      else {
        local_6c = 0x82;
        std::make_shared<ImplicitNullType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_60);
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<VarBind_const&,std::shared_ptr<ImplicitNullType>>
                  (local_68,__args,(shared_ptr<ImplicitNullType> *)&local_60);
      }
    }
    else {
      ValueCallback::getValueForCallback(&local_60,callback);
      if (local_60._vptr_ValueCallback == (_func_int **)0x0) {
        local_6c = GEN_ERR;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                  (local_68,&callback->OID,&local_6c);
      }
      else {
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                  (local_68,&callback->OID,(shared_ptr<BER_CONTAINER> *)&local_60);
      }
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.OID);
    __args = __args + 1;
    if (__args == pVVar1) {
      __args = local_48[1];
      local_48 = local_48 + 1;
      pVVar1 = __args + 10;
    }
  }
  return true;
}

Assistant:

bool handleGetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion, bool isGetNextRequest){
    SNMP_LOGD("handleGetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), isGetNextRequest);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
#if 1
            // According to RFC3416 we should be setting the value to 'noSuchObject' or 'noSuchInstance,
            // but this doesn't seem to render nicely in tools, so possibly revert to old NO_SUCH_NAME error
            if(isGetNextRequest){
                // if it's a walk it's an endOfMibView
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(ENDOFMIBVIEW));
            } else {
                outResponseList.emplace_back(requestVarBind, std::make_shared<ImplicitNullType>(NOSUCHOBJECT));
            }

#else
            outResponseList.emplace_back(generateErrorResponse(SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME), requestVarBind.oid));
#endif
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job, even if we filled in nothing
}